

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_vector3.c
# Opt level: O0

char * vector3_all_tests(void)

{
  undefined8 local_10;
  
  local_10 = test_vector3_cross_product();
  test_message = local_10;
  tests_run = tests_run + 1;
  if (local_10 == (char *)0x0) {
    local_10 = (char *)0x0;
  }
  return local_10;
}

Assistant:

static char *vector3_all_tests(void)
{
	run_test(test_vector3_cross_product);

	return NULL;
}